

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_stat(char *_fname,PHYSFS_Stat *stat)

{
  _func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *p_Var1;
  void *pvVar2;
  undefined1 *ptr;
  size_t sVar3;
  PHYSFS_Stat *pPVar4;
  int iVar5;
  PHYSFS_ErrorCode PVar6;
  size_t sVar7;
  DirHandle *pDVar8;
  char *pcVar9;
  undefined1 *puVar10;
  undefined1 auStack_68 [15];
  byte local_59;
  undefined1 *local_58;
  char *local_50;
  char *arcfname;
  DirHandle *pDStack_40;
  int exists;
  DirHandle *i;
  size_t len;
  char *fname;
  PHYSFS_Stat *pPStack_20;
  int retval;
  PHYSFS_Stat *stat_local;
  char *_fname_local;
  
  puVar10 = auStack_68;
  fname._4_4_ = 0;
  pPStack_20 = stat;
  stat_local = (PHYSFS_Stat *)_fname;
  if (_fname == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    _fname_local._4_4_ = 0;
  }
  else if (stat == (PHYSFS_Stat *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    _fname_local._4_4_ = 0;
  }
  else {
    sVar7 = strlen(_fname);
    pDVar8 = (DirHandle *)(sVar7 + 1);
    if (pDVar8 < (DirHandle *)0x100) {
      puVar10 = auStack_68 + -(sVar7 + 0x18 & 0xfffffffffffffff0);
      local_58 = puVar10;
    }
    else {
      local_58 = (undefined1 *)0x0;
    }
    ptr = local_58;
    i = pDVar8;
    *(undefined8 *)(puVar10 + -8) = 0x10a7e2;
    pcVar9 = (char *)__PHYSFS_initSmallAlloc(ptr,(size_t)pDVar8);
    pPVar4 = stat_local;
    len = (size_t)pcVar9;
    if (pcVar9 == (char *)0x0) {
      *(undefined8 *)(puVar10 + -8) = 0x10a7f7;
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      _fname_local._4_4_ = 0;
    }
    else {
      pPStack_20->filesize = -1;
      pPStack_20->modtime = -1;
      pPStack_20->createtime = -1;
      pPStack_20->accesstime = -1;
      pPStack_20->filetype = PHYSFS_FILETYPE_OTHER;
      pPStack_20->readonly = 1;
      *(undefined8 *)(puVar10 + -8) = 0x10a857;
      iVar5 = sanitizePlatformIndependentPath((char *)pPVar4,pcVar9);
      if (iVar5 != 0) {
        if (*(char *)len == '\0') {
          pPStack_20->filetype = PHYSFS_FILETYPE_DIRECTORY;
          pPStack_20->readonly = (uint)((writeDir != (DirHandle *)0x0 ^ 0xffU) & 1);
          fname._4_4_ = 1;
        }
        else {
          arcfname._4_4_ = 0;
          *(undefined8 *)(puVar10 + -8) = 0x10a8af;
          __PHYSFS_platformGrabMutex(stateLock);
          pDStack_40 = searchPath;
          while( true ) {
            sVar3 = len;
            pDVar8 = pDStack_40;
            local_59 = 0;
            if (pDStack_40 != (DirHandle *)0x0) {
              local_59 = arcfname._4_4_ != 0 ^ 0xff;
            }
            if ((local_59 & 1) == 0) break;
            local_50 = (char *)len;
            *(undefined8 *)(puVar10 + -8) = 0x10a8f3;
            arcfname._4_4_ = partOfMountPoint(pDVar8,(char *)sVar3);
            pDVar8 = pDStack_40;
            if (arcfname._4_4_ == 0) {
              *(undefined8 *)(puVar10 + -8) = 0x10a92a;
              iVar5 = verifyPath(pDVar8,&local_50,0);
              pPVar4 = pPStack_20;
              pcVar9 = local_50;
              if (iVar5 != 0) {
                p_Var1 = pDStack_40->funcs->stat;
                pvVar2 = pDStack_40->opaque;
                *(undefined8 *)(puVar10 + -8) = 0x10a94c;
                fname._4_4_ = (*p_Var1)(pvVar2,pcVar9,pPVar4);
                if (fname._4_4_ == 0) {
                  *(undefined8 *)(puVar10 + -8) = 0x10a95a;
                  PVar6 = currentErrorCode();
                  if (PVar6 == PHYSFS_ERR_NOT_FOUND) goto LAB_0010a96a;
                }
                arcfname._4_4_ = 1;
              }
            }
            else {
              pPStack_20->filetype = PHYSFS_FILETYPE_DIRECTORY;
              pPStack_20->readonly = 1;
              fname._4_4_ = 1;
            }
LAB_0010a96a:
            pDStack_40 = pDStack_40->next;
          }
          *(undefined8 *)(puVar10 + -8) = 0x10a989;
          __PHYSFS_platformReleaseMutex(stateLock);
        }
      }
      sVar3 = len;
      *(undefined8 *)(puVar10 + -8) = 0x10a994;
      __PHYSFS_smallFree((void *)sVar3);
      _fname_local._4_4_ = fname._4_4_;
    }
  }
  return _fname_local._4_4_;
}

Assistant:

int PHYSFS_stat(const char *_fname, PHYSFS_Stat *stat)
{
    int retval = 0;
    char *fname;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!stat, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    len = strlen(_fname) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF(!fname, PHYSFS_ERR_OUT_OF_MEMORY, 0);

    /* set some sane defaults... */
    stat->filesize = -1;
    stat->modtime = -1;
    stat->createtime = -1;
    stat->accesstime = -1;
    stat->filetype = PHYSFS_FILETYPE_OTHER;
    stat->readonly = 1;

    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        if (*fname == '\0')
        {
            stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
            stat->readonly = !writeDir; /* Writeable if we have a writeDir */
            retval = 1;
        } /* if */
        else
        {
            DirHandle *i;
            int exists = 0;
            __PHYSFS_platformGrabMutex(stateLock);
            for (i = searchPath; ((i != NULL) && (!exists)); i = i->next)
            {
                char *arcfname = fname;
                exists = partOfMountPoint(i, arcfname);
                if (exists)
                {
                    stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
                    stat->readonly = 1;
                    retval = 1;
                } /* if */
                else if (verifyPath(i, &arcfname, 0))
                {
                    retval = i->funcs->stat(i->opaque, arcfname, stat);
                    if ((retval) || (currentErrorCode() != PHYSFS_ERR_NOT_FOUND))
                        exists = 1;
                } /* else if */
            } /* for */
            __PHYSFS_platformReleaseMutex(stateLock);
        } /* else */
    } /* if */

    __PHYSFS_smallFree(fname);
    return retval;
}